

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::bitmapFromData
               (unsigned_short *data,int nData,uchar *bitmap,unsigned_short *minNonZero,
               unsigned_short *maxNonZero)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (lVar1 = 0; lVar1 != 0x2000; lVar1 = lVar1 + 1) {
    bitmap[lVar1] = '\0';
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)nData;
  if (nData < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    bitmap[data[uVar3] >> 3] = bitmap[data[uVar3] >> 3] | (byte)(1 << ((byte)data[uVar3] & 7));
  }
  *bitmap = *bitmap & 0xfe;
  *minNonZero = 0x1fff;
  *maxNonZero = 0;
  uVar3 = 0;
  for (uVar2 = 0; uVar2 != 0x2000; uVar2 = uVar2 + 1) {
    if (bitmap[uVar2] != '\0') {
      if (uVar2 < *minNonZero) {
        *minNonZero = (unsigned_short)uVar2;
        uVar3 = (ulong)*maxNonZero;
      }
      if ((uVar3 & 0xffff) < uVar2) {
        *maxNonZero = (unsigned_short)uVar2;
        uVar3 = uVar2 & 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void bitmapFromData(const unsigned short data[/*nData*/], int nData,
                    unsigned char bitmap[BITMAP_SIZE],
                    unsigned short &minNonZero, unsigned short &maxNonZero) {
  for (int i = 0; i < BITMAP_SIZE; ++i) bitmap[i] = 0;

  for (int i = 0; i < nData; ++i) bitmap[data[i] >> 3] |= (1 << (data[i] & 7));

  bitmap[0] &= ~1;  // zero is not explicitly stored in
                    // the bitmap; we assume that the
                    // data always contain zeroes
  minNonZero = BITMAP_SIZE - 1;
  maxNonZero = 0;

  for (int i = 0; i < BITMAP_SIZE; ++i) {
    if (bitmap[i]) {
      if (minNonZero > i) minNonZero = i;
      if (maxNonZero < i) maxNonZero = i;
    }
  }
}